

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest_FindFileContainingExtension_Test::
TestBody(MergedDescriptorDatabaseTest_FindFileContainingExtension_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  char *in_R9;
  string local_a20;
  AssertHelper local_a00;
  Message local_9f8;
  allocator<char> local_9e9;
  string local_9e8;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar__6;
  FileDescriptorProto file_5;
  AssertHelper local_898;
  Message local_890;
  allocator<char> local_881;
  string local_880;
  bool local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_828;
  Message local_820;
  allocator<char> local_811;
  string local_810;
  bool local_7e9;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar__4;
  FileDescriptorProto file_4;
  string local_6d8;
  AssertHelper local_6b8;
  Message local_6b0;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_678;
  Message local_670;
  allocator<char> local_661;
  string local_660;
  bool local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__3;
  FileDescriptorProto file_3;
  string local_528;
  AssertHelper local_508;
  Message local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4c8;
  Message local_4c0;
  allocator<char> local_4b1;
  string local_4b0;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__2;
  FileDescriptorProto file_2;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_318;
  Message local_310;
  allocator<char> local_301;
  string local_300;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__1;
  FileDescriptorProto file_1;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  AssertHelper local_168;
  Message local_160 [3];
  allocator<char> local_141;
  string local_140;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  MergedDescriptorDatabaseTest_FindFileContainingExtension_Test *this_local;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Foo",&local_141);
  local_119 = MergedDescriptorDatabase::FindFileContainingExtension
                        (&(this->super_MergedDescriptorDatabaseTest).forward_merged_,&local_140,3,
                         (FileDescriptorProto *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_118,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Foo\", 3, &file)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x30c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_198,"\"foo.proto\"","file.name()",(char (*) [10])0x1e1d402,psVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x30d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"Foo",(allocator<char> *)((long)&file_1.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar_.message_,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_1.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Bar",&local_301);
  local_2d9 = MergedDescriptorDatabase::FindFileContainingExtension
                        (&(this->super_MergedDescriptorDatabaseTest).forward_merged_,&local_300,5,
                         (FileDescriptorProto *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_2d8,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Bar\", 5, &file)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x314,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__1.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_348,"\"bar.proto\"","file.name()",(char (*) [10])0x1e1d7ee,psVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Bar",(allocator<char> *)((long)&file_2.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar__1.message_,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_2.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"Baz",&local_4b1);
  local_489 = MergedDescriptorDatabase::FindFileContainingExtension
                        (&(this->super_MergedDescriptorDatabaseTest).forward_merged_,&local_4b0,0xc,
                         (FileDescriptorProto *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_488,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Baz\", 12, &file)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x31c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4c8,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper(&local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__2.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4f8,"\"baz.proto\"","file.name()",(char (*) [10])0x1e1cf74,psVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x31d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"FromPool1",(allocator<char> *)((long)&file_3.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar__2.message_,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_3.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"Baz",&local_661);
  local_639 = MergedDescriptorDatabase::FindFileContainingExtension
                        (&(this->super_MergedDescriptorDatabaseTest).reverse_merged_,&local_660,0xc,
                         (FileDescriptorProto *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_639,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_638,
               (AssertionResult *)"reverse_merged_.FindFileContainingExtension(\"Baz\", 12, &file)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x324,pcVar2);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar__3.message_);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_6a8,"\"baz.proto\"","file.name()",(char (*) [10])0x1e1cf74,psVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x325,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"FromPool2",(allocator<char> *)((long)&file_4.field_0 + 0xe7));
  ExpectContainsType((FileDescriptorProto *)&gtest_ar__3.message_,&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&file_4.field_0 + 0xe7));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__3.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__4.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"Baz",&local_811);
  local_7e9 = MergedDescriptorDatabase::FindFileContainingExtension
                        (&(this->super_MergedDescriptorDatabaseTest).forward_merged_,&local_810,0xd,
                         (FileDescriptorProto *)&gtest_ar__4.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7e8,&local_7e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_7e8,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Baz\", 13, &file)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x32d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"Baz",&local_881);
  bVar1 = MergedDescriptorDatabase::FindFileContainingExtension
                    (&(this->super_MergedDescriptorDatabaseTest).reverse_merged_,&local_880,0xd,
                     (FileDescriptorProto *)&gtest_ar__4.message_);
  local_859 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_858,&local_859,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&file_5.field_0 + 0xe0),(internal *)local_858,
               (AssertionResult *)"reverse_merged_.FindFileContainingExtension(\"Baz\", 13, &file)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x32e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    std::__cxx11::string::~string((string *)((long)&file_5.field_0 + 0xe0));
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__4.message_);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"Foo",&local_9e9);
  bVar1 = MergedDescriptorDatabase::FindFileContainingExtension
                    (&(this->super_MergedDescriptorDatabaseTest).forward_merged_,&local_9e8,6,
                     (FileDescriptorProto *)&gtest_ar__6.message_);
  local_9c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c0,&local_9c1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a20,(internal *)local_9c0,
               (AssertionResult *)"forward_merged_.FindFileContainingExtension(\"Foo\", 6, &file)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x334,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper(&local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    testing::Message::~Message(&local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__6.message_);
  return;
}

Assistant:

TEST_F(MergedDescriptorDatabaseTest, FindFileContainingExtension) {
  {
    // Can find file that is only in database1_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Foo", 3, &file));
    EXPECT_EQ("foo.proto", file.name());
    ExpectContainsType(file, "Foo");
  }

  {
    // Can find file that is only in database2_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Bar", 5, &file));
    EXPECT_EQ("bar.proto", file.name());
    ExpectContainsType(file, "Bar");
  }

  {
    // In forward_merged_, database1_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool1");
  }

  {
    // In reverse_merged_, database2_'s baz.proto takes precedence.
    FileDescriptorProto file;
    EXPECT_TRUE(reverse_merged_.FindFileContainingExtension("Baz", 12, &file));
    EXPECT_EQ("baz.proto", file.name());
    ExpectContainsType(file, "FromPool2");
  }

  {
    // Baz's extension 13 only shows up in forward_merged_ because it is
    // masked by database2_'s baz.proto in reverse_merged_.
    FileDescriptorProto file;
    EXPECT_TRUE(forward_merged_.FindFileContainingExtension("Baz", 13, &file));
    EXPECT_FALSE(reverse_merged_.FindFileContainingExtension("Baz", 13, &file));
  }

  {
    // Can't find non-existent extension.
    FileDescriptorProto file;
    EXPECT_FALSE(forward_merged_.FindFileContainingExtension("Foo", 6, &file));
  }
}